

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gluContextInfo.cpp
# Opt level: O3

void __thiscall glu::ContextInfo::ContextInfo(ContextInfo *this,RenderContext *context)

{
  pointer pbVar1;
  int iVar2;
  uint uVar3;
  deUint32 dVar4;
  undefined4 extraout_var;
  char *pcVar5;
  long lVar6;
  char *__s;
  long lVar7;
  long lVar8;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *this_00;
  int numExtensions;
  allocator<char> local_99;
  undefined1 local_98 [32];
  _Base_ptr local_78;
  size_t local_70;
  set<int,_std::less<int>,_std::allocator<int>_> *local_60;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *local_58;
  long *local_50 [2];
  long local_40 [2];
  
  this->_vptr_ContextInfo = (_func_int **)&PTR__ContextInfo_00d1b5e8;
  this->m_context = context;
  this_00 = &this->m_extensions;
  (this->m_extensions).
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->m_extensions).
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->m_extensions).
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_98._24_8_ = local_98 + 8;
  local_98._16_8_ = (_Base_ptr)0x0;
  local_98._0_8_ = (pointer)0x0;
  local_98._8_8_ = 0;
  local_70 = 0;
  local_60 = &(this->m_compressedTextureFormats).m_value;
  local_78 = (_Base_ptr)local_98._24_8_;
  std::_Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_>::_Rb_tree
            (&local_60->_M_t,
             (_Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_> *)
             local_98);
  (this->m_compressedTextureFormats).m_isComputed = false;
  std::_Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_>::~_Rb_tree
            ((_Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_> *)
             local_98);
  iVar2 = (*context->_vptr_RenderContext[3])(context);
  lVar6 = CONCAT44(extraout_var,iVar2);
  uVar3 = (*context->_vptr_RenderContext[2])(context);
  if ((uVar3 & 0x3ff) != 2) {
    local_98._0_8_ = local_98._0_8_ & 0xffffffff00000000;
    (**(code **)(lVar6 + 0x868))(0x821d);
    dVar4 = (**(code **)(lVar6 + 0x800))();
    checkError(dVar4,"glGetIntegerv(GL_NUM_EXTENSIONS) failed",
               "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/framework/opengl/gluContextInfo.cpp"
               ,0xca);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::resize(this_00,(long)(int)local_98._0_4_);
    if (0 < (int)local_98._0_4_) {
      lVar7 = 0;
      lVar8 = 0;
      local_58 = this_00;
      do {
        __s = (char *)(**(code **)(lVar6 + 0xa80))(0x1f03);
        pbVar1 = (this_00->
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 )._M_impl.super__Vector_impl_data._M_start;
        pcVar5 = *(char **)((long)&pbVar1->_M_string_length + lVar7);
        strlen(__s);
        this_00 = local_58;
        std::__cxx11::string::_M_replace
                  ((long)&(pbVar1->_M_dataplus)._M_p + lVar7,0,pcVar5,(ulong)__s);
        lVar8 = lVar8 + 1;
        lVar7 = lVar7 + 0x20;
      } while (lVar8 < (int)local_98._0_4_);
    }
    dVar4 = (**(code **)(lVar6 + 0x800))();
    checkError(dVar4,"glGetStringi(GL_EXTENSIONS, ndx) failed",
               "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/framework/opengl/gluContextInfo.cpp"
               ,0xcf);
    return;
  }
  pcVar5 = (char *)(**(code **)(lVar6 + 0xa78))(0x1f03);
  dVar4 = (**(code **)(lVar6 + 0x800))();
  checkError(dVar4,"glGetString(GL_EXTENSIONS) failed",
             "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/framework/opengl/gluContextInfo.cpp"
             ,0xc1);
  std::__cxx11::string::string<std::allocator<char>>((string *)local_50,pcVar5,&local_99);
  lVar6 = std::__cxx11::string::find((char)local_50,0x20);
  if (lVar6 != -1) {
    do {
      lVar7 = lVar6;
      std::__cxx11::string::substr((ulong)local_98,(ulong)local_50);
      std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
      emplace_back<std::__cxx11::string>
                ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)this_00,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_98);
      if ((undefined1 *)local_98._0_8_ != local_98 + 0x10) {
        operator_delete((void *)local_98._0_8_,(ulong)(local_98._16_8_ + 1));
      }
      lVar6 = std::__cxx11::string::find((char)local_50,0x20);
    } while (lVar6 != -1);
    if (lVar7 == -2) goto LAB_00a0cd4e;
  }
  std::__cxx11::string::substr((ulong)local_98,(ulong)local_50);
  std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
  emplace_back<std::__cxx11::string>
            ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)this_00,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_98);
  if ((undefined1 *)local_98._0_8_ != local_98 + 0x10) {
    operator_delete((void *)local_98._0_8_,(ulong)(local_98._16_8_ + 1));
  }
LAB_00a0cd4e:
  if (local_50[0] != local_40) {
    operator_delete(local_50[0],local_40[0] + 1);
  }
  return;
}

Assistant:

ContextInfo::ContextInfo (const RenderContext& context)
	: m_context(context)
{
	const glw::Functions& gl = context.getFunctions();

	if (context.getType().getAPI() == ApiType::es(2,0))
	{
		const char* result = (const char*)gl.getString(GL_EXTENSIONS);
		GLU_EXPECT_NO_ERROR(gl.getError(), "glGetString(GL_EXTENSIONS) failed");

		split(m_extensions, string(result));
	}
	else
	{
		int				numExtensions	= 0;

		gl.getIntegerv(GL_NUM_EXTENSIONS, &numExtensions);
		GLU_EXPECT_NO_ERROR(gl.getError(), "glGetIntegerv(GL_NUM_EXTENSIONS) failed");

		m_extensions.resize(numExtensions);
		for (int ndx = 0; ndx < numExtensions; ndx++)
			m_extensions[ndx] = (const char*)gl.getStringi(GL_EXTENSIONS, ndx);
		GLU_EXPECT_NO_ERROR(gl.getError(), "glGetStringi(GL_EXTENSIONS, ndx) failed");
	}
}